

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exporter.cpp
# Opt level: O0

void __thiscall Assimp::Exporter::SetProgressHandler(Exporter *this,ProgressHandler *pHandler)

{
  ProgressHandler *pPVar1;
  ProgressHandler *pHandler_local;
  Exporter *this_local;
  
  if (this->pimpl == (ExporterPimpl *)0x0) {
    __assert_fail("nullptr != pimpl",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/Exporter.cpp"
                  ,0x114,"void Assimp::Exporter::SetProgressHandler(ProgressHandler *)");
  }
  if (pHandler == (ProgressHandler *)0x0) {
    pPVar1 = (ProgressHandler *)
             Intern::AllocateFromAssimpHeap::operator_new((AllocateFromAssimpHeap *)0x8,0);
    memset(pPVar1,0,8);
    DefaultProgressHandler::DefaultProgressHandler((DefaultProgressHandler *)pPVar1);
    this->pimpl->mProgressHandler = pPVar1;
    this->pimpl->mIsDefaultProgressHandler = true;
  }
  else if (this->pimpl->mProgressHandler != pHandler) {
    pPVar1 = this->pimpl->mProgressHandler;
    if (pPVar1 != (ProgressHandler *)0x0) {
      (*pPVar1->_vptr_ProgressHandler[1])();
    }
    this->pimpl->mProgressHandler = pHandler;
    this->pimpl->mIsDefaultProgressHandler = false;
  }
  return;
}

Assistant:

void Exporter::SetProgressHandler(ProgressHandler* pHandler) {
    ai_assert(nullptr != pimpl);

    if ( nullptr == pHandler) {
        // Release pointer in the possession of the caller
        pimpl->mProgressHandler = new DefaultProgressHandler();
        pimpl->mIsDefaultProgressHandler = true;
        return;
    }

    if (pimpl->mProgressHandler == pHandler) {
        return;
    }

    delete pimpl->mProgressHandler;
    pimpl->mProgressHandler = pHandler;
    pimpl->mIsDefaultProgressHandler = false;
}